

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

errr finish_parse_slay(parser *p)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  angband_constants *paVar8;
  slay_conflict *psVar9;
  void *pvVar10;
  undefined8 *p_00;
  byte bVar11;
  size_t len;
  ulong uVar12;
  long lVar13;
  errr local_34;
  
  z_info->slay_max = '\0';
  pvVar10 = parser_priv(p);
  paVar8 = z_info;
  uVar12 = (ulong)z_info->slay_max;
  len = uVar12 * 0x38;
  do {
    len = len + 0x38;
    if (pvVar10 == (void *)0x0) {
      local_34 = 0;
LAB_001931b5:
      slays = (slay_conflict *)mem_zalloc(len);
      p_00 = (undefined8 *)parser_priv(p);
      uVar12 = 1;
      lVar13 = 0;
      while (psVar9 = slays, p_00 != (undefined8 *)0x0) {
        puVar2 = (undefined8 *)p_00[6];
        if (uVar12 <= z_info->slay_max) {
          *(undefined8 *)((long)&slays[1].next + lVar13) = p_00[6];
          uVar3 = *p_00;
          uVar4 = p_00[1];
          uVar5 = p_00[2];
          uVar6 = p_00[3];
          uVar7 = p_00[5];
          puVar1 = (undefined8 *)((long)&psVar9[1].range_verb + lVar13);
          *puVar1 = p_00[4];
          puVar1[1] = uVar7;
          puVar1 = (undefined8 *)((long)&psVar9[1].base + lVar13);
          *puVar1 = uVar5;
          puVar1[1] = uVar6;
          puVar1 = (undefined8 *)((long)&psVar9[1].code + lVar13);
          *puVar1 = uVar3;
          puVar1[1] = uVar4;
          *(undefined8 *)((long)&slays[1].next + lVar13) = 0;
        }
        mem_free(p_00);
        uVar12 = uVar12 + 1;
        lVar13 = lVar13 + 0x38;
        p_00 = puVar2;
      }
      z_info->slay_max = z_info->slay_max + '\x01';
      parser_destroy(p);
      return local_34;
    }
    if (0xfd < (byte)uVar12) {
      local_34 = 0x3b;
      goto LAB_001931b5;
    }
    bVar11 = (byte)uVar12 + 1;
    uVar12 = (ulong)bVar11;
    paVar8->slay_max = bVar11;
    pvVar10 = *(void **)((long)pvVar10 + 0x30);
  } while( true );
}

Assistant:

static errr finish_parse_slay(struct parser *p) {
	struct slay *slay, *next = NULL;
	int count = 1;
	errr result = PARSE_ERROR_NONE;

	/* Count the entries */
	z_info->slay_max = 0;
	slay = parser_priv(p);
	while (slay) {
		if (z_info->slay_max >= 254) {
			result = PARSE_ERROR_TOO_MANY_ENTRIES;
			break;
		}
		z_info->slay_max++;
		slay = slay->next;
	}

	/* Allocate the direct access list and copy the data to it */
	slays = mem_zalloc((z_info->slay_max + 1) * sizeof(*slay));
	for (slay = parser_priv(p); slay; slay = next, count++) {
		next = slay->next;
		if (count <= z_info->slay_max) {
			memcpy(&slays[count], slay, sizeof(*slay));
			slays[count].next = NULL;
		}
		mem_free(slay);
	}
	z_info->slay_max += 1;

	parser_destroy(p);
	return result;
}